

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::registerAward(Map *this,char type,int duration)

{
  int i;
  int iVar1;
  long lVar2;
  long lVar3;
  Award *pAVar4;
  
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 0x14) {
      lVar2 = 0;
      do {
        lVar3 = lVar2;
        if (lVar3 == 0x14) {
          return;
        }
        lVar2 = lVar3 + 1;
      } while (this->award[lVar3] != (Award *)0x0);
      pAVar4 = (Award *)malloc(0xc);
      this->award[lVar3] = pAVar4;
      iVar1 = SDL_GetTicks();
      pAVar4 = this->award[lVar3];
      pAVar4->activationTime = iVar1;
      pAVar4->type = type;
      pAVar4->duration = duration;
      return;
    }
    if ((this->award[lVar2] != (Award *)0x0) && (this->award[lVar2]->type == type)) break;
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void Map::registerAward(char type, int duration){
    for(int i=0; i< MAX_AWARDS; i++){
        if(award[i] && award[i]->type == type){
            return;
        }
    }
    for(int i=0; i< MAX_AWARDS; i++){
        if(!award[i]){
            award[i] = (Award *)malloc(sizeof(Award));
            award[i]->activationTime = SDL_GetTicks();
            award[i]->type = type;
            award[i]->duration = duration;
            break;
        }
    }
}